

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O1

void __thiscall Array::~Array(Array *this)

{
  long lVar1;
  
  this->_vptr_Array = (_func_int **)&PTR__Array_00104d08;
  if (0 < this->_height) {
    lVar1 = 0;
    do {
      if (this->_data[lVar1] != (int *)0x0) {
        operator_delete__(this->_data[lVar1]);
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < this->_height);
  }
  if (this->_data != (int **)0x0) {
    operator_delete__(this->_data);
    return;
  }
  return;
}

Assistant:

Array::~Array()
{
	for (int i = 0; i < _height; ++i) {
			delete[] _data[i];
	}

	delete[] _data;
}